

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

uint16_t __thiscall ami_nvar_t::nvar_entry_body_t::extended_header_size(nvar_entry_body_t *this)

{
  bool bVar1;
  uint16_t uVar2;
  nvar_entry_t *pnVar3;
  nvar_attributes_t *pnVar4;
  nvar_entry_body_t *this_local;
  
  if ((this->f_extended_header_size & 1U) != 0) {
    return this->m_extended_header_size;
  }
  pnVar3 = _parent(this);
  pnVar4 = nvar_entry_t::attributes(pnVar3);
  bVar1 = nvar_attributes_t::extended_header(pnVar4);
  if (bVar1) {
    pnVar3 = _parent(this);
    pnVar4 = nvar_entry_t::attributes(pnVar3);
    bVar1 = nvar_attributes_t::valid(pnVar4);
    if (bVar1) {
      pnVar3 = _parent(this);
      uVar2 = nvar_entry_t::size(pnVar3);
      if (0xc < uVar2) {
        uVar2 = extended_header_size_field(this);
        if (uVar2 < 3) {
          uVar2 = 0;
        }
        else {
          uVar2 = extended_header_size_field(this);
        }
        goto LAB_001ac51a;
      }
    }
  }
  uVar2 = 0;
LAB_001ac51a:
  this->m_extended_header_size = uVar2;
  this->f_extended_header_size = true;
  return this->m_extended_header_size;
}

Assistant:

uint16_t ami_nvar_t::nvar_entry_body_t::extended_header_size() {
    if (f_extended_header_size)
        return m_extended_header_size;
    m_extended_header_size = (( ((_parent()->attributes()->extended_header()) && (_parent()->attributes()->valid()) && (_parent()->size() > (((4 + 2) + 4) + 2))) ) ? (((extended_header_size_field() >= (1 + 2)) ? (extended_header_size_field()) : (0))) : (0));
    f_extended_header_size = true;
    return m_extended_header_size;
}